

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__zexpand(stbi__zbuf *z,char *zout,int n)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  uint local_38;
  uint old_limit;
  uint limit;
  uint cur;
  char *q;
  int n_local;
  char *zout_local;
  stbi__zbuf *z_local;
  
  z->zout = zout;
  if (z->z_expandable == 0) {
    z_local._4_4_ = stbi__err("Corrupt PNG");
  }
  else {
    uVar1 = (int)z->zout - (int)z->zout_start;
    local_38 = (int)z->zout_end - (int)z->zout_start;
    if (-uVar1 - 1 < (uint)n) {
      z_local._4_4_ = stbi__err("Out of memory");
    }
    else {
      for (; local_38 < uVar1 + n; local_38 = local_38 << 1) {
        if (0x7fffffff < local_38) {
          iVar2 = stbi__err("Out of memory");
          return iVar2;
        }
      }
      pcVar3 = (char *)realloc(z->zout_start,(ulong)local_38);
      if (pcVar3 == (char *)0x0) {
        z_local._4_4_ = stbi__err("Out of memory");
      }
      else {
        z->zout_start = pcVar3;
        z->zout = pcVar3 + uVar1;
        z->zout_end = pcVar3 + local_38;
        z_local._4_4_ = 1;
      }
    }
  }
  return z_local._4_4_;
}

Assistant:

static int stbi__zexpand(stbi__zbuf *z, char *zout, int n)  // need to make room for n bytes
{
   char *q;
   unsigned int cur, limit, old_limit;
   z->zout = zout;
   if (!z->z_expandable) return stbi__err("output buffer limit","Corrupt PNG");
   cur   = (unsigned int) (z->zout - z->zout_start);
   limit = old_limit = (unsigned) (z->zout_end - z->zout_start);
   if (UINT_MAX - cur < (unsigned) n) return stbi__err("outofmem", "Out of memory");
   while (cur + n > limit) {
      if(limit > UINT_MAX / 2) return stbi__err("outofmem", "Out of memory");
      limit *= 2;
   }
   q = (char *) STBI_REALLOC_SIZED(z->zout_start, old_limit, limit);
   STBI_NOTUSED(old_limit);
   if (q == NULL) return stbi__err("outofmem", "Out of memory");
   z->zout_start = q;
   z->zout       = q + cur;
   z->zout_end   = q + limit;
   return 1;
}